

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkmap.c
# Opt level: O1

void mkmap(level *lev,lev_init *init_lev)

{
  mkroom *__s;
  char cVar1;
  char btyp;
  char cVar2;
  char cVar3;
  long lVar4;
  byte bVar5;
  boolean bVar6;
  uint uVar7;
  undefined1 *puVar8;
  mkroom *pmVar9;
  int i;
  int iVar10;
  uint uVar11;
  long lVar12;
  char *pcVar13;
  mkroom *croom;
  int j;
  long lVar14;
  schar *psVar15;
  char cVar16;
  level *plVar17;
  char cVar18;
  long lVar19;
  char *pcVar20;
  undefined1 *puVar21;
  short sVar22;
  int y;
  ulong uVar23;
  schar sVar24;
  uint uVar25;
  uint uVar26;
  char cVar27;
  bool bVar28;
  coord local_6c;
  coord sm;
  long local_58;
  
  cVar1 = init_lev->fg;
  btyp = init_lev->bg;
  cVar16 = init_lev->smoothed;
  cVar2 = init_lev->joined;
  cVar27 = init_lev->lit;
  cVar3 = init_lev->walled;
  if (cVar27 < '\0') {
    bVar5 = depth(&u.uz);
    uVar7 = mt_random();
    cVar27 = '\0';
    if (uVar7 % (uint)(byte)(((bVar5 ^ (char)bVar5 >> 7) - ((char)bVar5 >> 7)) + 1) < 10) {
      uVar7 = mt_random();
      cVar27 = 0x3531dec < uVar7 * 0x3f2b3885;
    }
  }
  new_locations = (char *)malloc(0x62c);
  if (btyp < '\'') {
    puVar8 = &lev->locations[1][0].field_0x6;
    lVar12 = 1;
    do {
      lVar14 = 0;
      do {
        puVar8[lVar14 + -2] = btyp;
        puVar8[lVar14 + 1] = puVar8[lVar14 + 1] & 0xfb;
        lVar14 = lVar14 + 0xc;
      } while (lVar14 != 0xfc);
      lVar12 = lVar12 + 1;
      puVar8 = puVar8 + 0xfc;
    } while (lVar12 != 0x50);
  }
  if (cVar1 < '\'') {
    lVar12 = 0;
    do {
      uVar7 = mt_random();
      uVar26 = uVar7 % 0x4d + 2;
      uVar7 = mt_random();
      uVar7 = uVar7 % 0x13 + 1;
      if (lev->locations[uVar26][uVar7].typ == btyp) {
        lev->locations[uVar26][uVar7].typ = cVar1;
        lVar12 = lVar12 + 1;
      }
    } while (lVar12 < 0x270);
  }
  lVar12 = 2;
  do {
    lVar14 = 1;
    do {
      lVar19 = 0;
      uVar7 = 0;
      do {
        sVar24 = btyp;
        if ((0xffffffb1 < (dirs[lVar19 * 2] + (int)lVar12) - 0x4fU) &&
           (uVar26 = dirs[lVar19 * 2 + 1] + (int)lVar14, uVar26 < 0x14)) {
          sVar24 = lev->locations[(uint)(dirs[lVar19 * 2] + (int)lVar12)][uVar26].typ;
        }
        uVar7 = uVar7 + (sVar24 == cVar1);
        lVar19 = lVar19 + 1;
      } while (lVar19 != 8);
      cVar18 = cVar1;
      if ((((uVar7 & 0xffff) - 5 < 4) || (cVar18 = btyp, (uVar7 & 0xffff) < 3)) && (cVar18 < '\''))
      {
        lev->locations[lVar12][lVar14].typ = cVar18;
      }
      lVar14 = lVar14 + 1;
    } while (lVar14 != 0x14);
    lVar12 = lVar12 + 1;
  } while (lVar12 != 0x4f);
  lVar12 = 2;
  do {
    lVar14 = 1;
    do {
      lVar19 = 0;
      sVar22 = 0;
      do {
        sVar24 = btyp;
        if ((0xffffffb1 < (dirs[lVar19 * 2] + (int)lVar12) - 0x4fU) &&
           (uVar7 = dirs[lVar19 * 2 + 1] + (int)lVar14, uVar7 < 0x14)) {
          sVar24 = lev->locations[(uint)(dirs[lVar19 * 2] + (int)lVar12)][uVar7].typ;
        }
        sVar22 = sVar22 + (ushort)(sVar24 == cVar1);
        lVar19 = lVar19 + 1;
      } while (lVar19 != 8);
      cVar18 = btyp;
      if (sVar22 != 5) {
        cVar18 = lev->locations[lVar12][lVar14].typ;
      }
      new_locations[lVar12 + lVar14 * 0x4f] = cVar18;
      lVar14 = lVar14 + 1;
    } while (lVar14 != 0x14);
    lVar12 = lVar12 + 1;
  } while (lVar12 != 0x4f);
  psVar15 = &lev->locations[2][1].typ;
  pcVar13 = new_locations + 0x51;
  lVar12 = 2;
  do {
    lVar14 = 0;
    pcVar20 = pcVar13;
    do {
      if (*pcVar20 < '\'') {
        psVar15[lVar14] = *pcVar20;
      }
      lVar14 = lVar14 + 0xc;
      pcVar20 = pcVar20 + 0x4f;
    } while (lVar14 != 0xe4);
    lVar12 = lVar12 + 1;
    psVar15 = psVar15 + 0xfc;
    pcVar13 = pcVar13 + 1;
  } while (lVar12 != 0x4f);
  if (cVar16 != '\0') {
    iVar10 = 0;
    do {
      lVar12 = 2;
      do {
        lVar14 = 1;
        do {
          lVar19 = 0;
          sVar22 = 0;
          do {
            cVar16 = btyp;
            if ((0xffffffb1 < (dirs[lVar19 * 2] + (int)lVar12) - 0x4fU) &&
               (uVar7 = dirs[lVar19 * 2 + 1] + (int)lVar14, uVar7 < 0x14)) {
              cVar16 = lev->locations[(uint)(dirs[lVar19 * 2] + (int)lVar12)][uVar7].typ;
            }
            sVar22 = sVar22 + (ushort)(cVar16 == cVar1);
            lVar19 = lVar19 + 1;
          } while (lVar19 != 8);
          cVar16 = btyp;
          if (2 < sVar22) {
            cVar16 = lev->locations[lVar12][lVar14].typ;
          }
          new_locations[lVar12 + lVar14 * 0x4f] = cVar16;
          lVar14 = lVar14 + 1;
        } while (lVar14 != 0x14);
        lVar12 = lVar12 + 1;
      } while (lVar12 != 0x4f);
      pcVar13 = new_locations + 0x51;
      lVar12 = 2;
      psVar15 = &lev->locations[2][1].typ;
      do {
        lVar14 = 0;
        pcVar20 = pcVar13;
        do {
          if (*pcVar20 < '\'') {
            psVar15[lVar14] = *pcVar20;
          }
          lVar14 = lVar14 + 0xc;
          pcVar20 = pcVar20 + 0x4f;
        } while (lVar14 != 0xe4);
        lVar12 = lVar12 + 1;
        psVar15 = psVar15 + 0xfc;
        pcVar13 = pcVar13 + 1;
      } while (lVar12 != 0x4f);
      bVar28 = iVar10 == 0;
      iVar10 = iVar10 + 1;
    } while (bVar28);
  }
  if (cVar2 != '\0') {
    __s = lev->rooms;
    local_58 = 2;
    do {
      lVar12 = 1;
      do {
        if ((lev->locations[local_58][lVar12].typ == cVar1) &&
           ((lev->locations[local_58][lVar12].field_0x8 & 0x3f) == 0)) {
          min_rx = (int)local_58;
          min_ry = (int)lVar12;
          n_loc_filled = 0;
          max_rx = min_rx;
          max_ry = min_ry;
          flood_fill_rm(lev,min_rx,min_ry,lev->nroom + 3,'\0','\0');
          if (n_loc_filled < 4) {
            if (min_rx <= max_rx) {
              puVar8 = &lev->locations[min_rx][0].field_0x6;
              lVar14 = (long)min_rx;
              do {
                if (min_ry <= max_ry) {
                  lVar19 = (long)min_ry + -1;
                  lVar4 = (long)min_ry * 0xc;
                  puVar21 = puVar8;
                  do {
                    if ((*(uint *)(puVar21 + lVar4) >> 0x10 & 0x3f) == lev->nroom + 3U) {
                      puVar21[lVar4 + -2] = btyp;
                      *(uint *)(puVar21 + lVar4) = *(uint *)(puVar21 + lVar4) & 0xffc0ffff;
                    }
                    lVar19 = lVar19 + 1;
                    puVar21 = puVar21 + 0xc;
                  } while (lVar19 < max_ry);
                }
                puVar8 = puVar8 + 0xfc;
                bVar28 = lVar14 < max_rx;
                lVar14 = lVar14 + 1;
              } while (bVar28);
            }
          }
          else {
            add_room(lev,min_rx,min_ry,max_rx,max_ry,'\0','\0','\x01');
            iVar10 = lev->nroom;
            __s[(long)iVar10 + -1].irregular = '\x01';
            if (0x4f < (long)iVar10) goto LAB_001db55d;
          }
        }
        lVar12 = lVar12 + 1;
      } while (lVar12 != 0x14);
      local_58 = local_58 + 1;
    } while (local_58 != 0x4f);
LAB_001db55d:
    if (1 < lev->nroom) {
      pmVar9 = lev->rooms + 1;
      croom = __s;
      do {
        bVar6 = somexy(lev,croom,&sm);
        if ((bVar6 == '\0') || (bVar6 = somexy(lev,pmVar9,&local_6c), bVar6 == '\0')) {
          impossible("No start/end room loc in join_map.");
          iVar10 = (int)croom->hx - (int)croom->lx;
          sm.x = (char)((uint)(iVar10 - (iVar10 >> 0x1f)) >> 1) + croom->lx;
          iVar10 = (int)croom->hy - (int)croom->ly;
          sm.y = (char)((uint)(iVar10 - (iVar10 >> 0x1f)) >> 1) + croom->ly;
          iVar10 = (int)pmVar9->hx - (int)pmVar9->lx;
          local_6c.x = (char)((uint)(iVar10 - (iVar10 >> 0x1f)) >> 1) + pmVar9->lx;
          iVar10 = (int)pmVar9->hy - (int)pmVar9->ly;
          local_6c.y = (char)((uint)(iVar10 - (iVar10 >> 0x1f)) >> 1) + pmVar9->ly;
        }
        dig_corridor(lev,&sm,&local_6c,'\0',cVar1,btyp);
        if ((croom->hx < pmVar9->lx) ||
           (((croom->hy < pmVar9->ly || (pmVar9->hy < croom->ly)) &&
            (uVar7 = mt_random(), 0x55555555 < uVar7 * -0x55555555)))) {
          croom = pmVar9;
        }
        pmVar9 = pmVar9 + 1;
      } while (pmVar9 < __s + lev->nroom);
    }
    pmVar9 = __s;
    if (0 < lev->nroom) {
      do {
        cVar16 = pmVar9->lx;
        if (cVar16 <= pmVar9->hx) {
          puVar8 = &lev->locations[cVar16][0].field_0x6;
          lVar12 = (long)cVar16;
          do {
            cVar16 = pmVar9->ly;
            if (cVar16 <= pmVar9->hy) {
              lVar14 = (long)cVar16 + -1;
              puVar21 = puVar8 + (long)cVar16 * 0xc;
              do {
                puVar21[2] = puVar21[2] & 0xc0;
                lVar14 = lVar14 + 1;
                puVar21 = puVar21 + 0xc;
              } while (lVar14 < pmVar9->hy);
            }
            puVar8 = puVar8 + 0xfc;
            bVar28 = lVar12 < pmVar9->hx;
            lVar12 = lVar12 + 1;
          } while (bVar28);
        }
        pmVar9 = pmVar9 + 1;
      } while (pmVar9 < __s + lev->nroom);
    }
    memset(__s,0,0x4530);
    lev->rooms[0].hx = -1;
    lev->subrooms->hx = -1;
    lev->nroom = 0;
  }
  if (cVar3 != '\0') {
    lVar12 = 1;
    uVar7 = 0xffffffff;
    lVar14 = 0;
    plVar17 = lev;
    do {
      uVar26 = 2;
      uVar23 = 0;
      do {
        if (lev->locations[lVar12][uVar23].typ == '\0') {
          uVar25 = (int)uVar23 - 1;
          do {
            lVar19 = 0x44;
            uVar11 = uVar7;
            do {
              if (((uVar25 < 0x15) && (uVar11 < 0x4f)) &&
                 (plVar17->levname[lVar19 + (ulong)uVar25 * 0xc] == '\x19')) {
                lev->locations[lVar12][uVar23].typ = '\x02' - (uVar23 == uVar25);
              }
              lVar19 = lVar19 + 0xfc;
              uVar11 = uVar11 + 1;
            } while (lVar19 != 0x338);
            uVar25 = uVar25 + 1;
          } while (uVar25 != uVar26);
        }
        uVar23 = uVar23 + 1;
        uVar26 = uVar26 + 1;
      } while (uVar23 != 0x15);
      lVar12 = lVar12 + 1;
      lVar14 = lVar14 + 1;
      plVar17 = (level *)&plVar17->locations[0][0xf].field_0x8;
      uVar7 = uVar7 + 1;
    } while (lVar14 != 0x4f);
  }
  if (cVar27 != '\0') {
    psVar15 = &lev->locations[1][0].typ;
    lVar12 = 1;
    do {
      lVar14 = 0;
      do {
        if (((('\x10' < cVar1) && (psVar15[lVar14] == cVar1)) ||
            ((('\x10' < btyp && (psVar15[lVar14] == btyp)) ||
             ((btyp == '\r' && (psVar15[lVar14] == '\r')))))) ||
           ((cVar3 != '\0' && (psVar15[lVar14] < '\r' && psVar15[lVar14] != '\0')))) {
          psVar15[lVar14 + 3] = psVar15[lVar14 + 3] | 4;
        }
        lVar14 = lVar14 + 0xc;
      } while (lVar14 != 0xfc);
      lVar12 = lVar12 + 1;
      psVar15 = psVar15 + 0xfc;
    } while (lVar12 != 0x50);
    iVar10 = lev->nroom;
    if (0 < (long)iVar10) {
      lVar12 = 0;
      do {
        *(undefined1 *)((long)lev->rooms[0].sbrooms + lVar12 + -0xb) = 1;
        lVar12 = lVar12 + 0xd8;
      } while ((long)iVar10 * 0xd8 - lVar12 != 0);
    }
  }
  puVar8 = &lev->locations[1][0].field_0x6;
  lVar12 = 1;
  do {
    lVar14 = 0;
    do {
      if (puVar8[lVar14 + -2] == '\x15') {
        puVar8[lVar14 + 1] = puVar8[lVar14 + 1] | 4;
      }
      lVar14 = lVar14 + 0xc;
    } while (lVar14 != 0xfc);
    lVar12 = lVar12 + 1;
    puVar8 = puVar8 + 0xfc;
  } while (lVar12 != 0x50);
  if ((cVar2 != '\0' && cVar3 != '\0') && (-1 < init_lev->filling)) {
    *(uint *)&(lev->flags).field_0x8 = *(uint *)&(lev->flags).field_0x8 & 0xfff5ffff | 0x80000;
    cVar1 = init_lev->filling;
    if (cVar1 < '\'') {
      puVar8 = &lev->locations[1][0].field_0x6;
      lVar12 = 1;
      do {
        lVar14 = 0;
        do {
          if ((puVar8[lVar14 + -2] == btyp) && (puVar8[lVar14 + -2] = cVar1, cVar1 == '\x15')) {
            puVar8[lVar14 + 1] = puVar8[lVar14 + 1] | 4;
          }
          lVar14 = lVar14 + 0xc;
        } while (lVar14 != 0xfc);
        lVar12 = lVar12 + 1;
        puVar8 = puVar8 + 0xfc;
      } while (lVar12 != 0x50);
    }
  }
  free(new_locations);
  return;
}

Assistant:

void mkmap(struct level *lev, lev_init *init_lev)
{
	schar	bg_typ = init_lev->bg,
		fg_typ = init_lev->fg;
	boolean smooth = init_lev->smoothed,
		join = init_lev->joined;
	xchar   lit = init_lev->lit,
		walled = init_lev->walled;
	int i;

	if (lit < 0)
	    lit = (rnd(1+abs(depth(&u.uz))) < 11 && rn2(77)) ? 1 : 0;

	new_locations = malloc((WIDTH+1) * HEIGHT);

	if (bg_typ < MAX_TYPE)
	    init_map(lev, bg_typ);
	init_fill(lev, bg_typ, fg_typ);

	for (i = 0; i < N_P1_ITER; i++)
	    pass_one(lev, bg_typ, fg_typ);

	for (i = 0; i < N_P2_ITER; i++)
	    pass_two(lev, bg_typ, fg_typ);

	if (smooth)
	    for (i = 0; i < N_P3_ITER; i++)
		pass_three(lev, bg_typ, fg_typ);

	if (join)
	    join_map(lev, bg_typ, fg_typ);

	finish_map(lev, fg_typ, bg_typ, (boolean)lit, (boolean)walled);
	/* a walled, joined level is cavernous, not mazelike -dlc
	 *
	 * also, caverns have a defined "inside" and "outside"; the outside
	 * doesn't _have_ to be stone, say, for hell.  so if the player
	 * defined a maze filler originally, go ahead and backfill the
	 * background in with that filler - DSR */
	if (walled && join && init_lev->filling > -1) {
	    lev->flags.is_maze_lev = FALSE;
	    lev->flags.is_cavernous_lev = TRUE;
	    backfill(lev, bg_typ, init_lev->filling);
	}
	free(new_locations);
}